

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsFederateClearUpdates(HelicsFederate fed)

{
  shared_ptr<helics::ValueFederate> fedObj;
  ValueFederate *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  getValueFedSharedPtr(&local_18,(HelicsError *)fed);
  if (local_18 != (ValueFederate *)0x0) {
    helics::ValueFederate::clearUpdates(local_18);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return;
}

Assistant:

void helicsFederateClearUpdates(HelicsFederate fed)
{
    auto fedObj = getValueFedSharedPtr(fed, nullptr);
    if (!fedObj) {
        return;
    }
    try {
        fedObj->clearUpdates();
    }
    // LCOV_EXCL_START
    catch (...) {
        ;
    }
    // LCOV_EXCL_STOP
}